

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall CSlidingBucket::createbucket(CSlidingBucket *this,int bucketindex)

{
  undefined1 auVar1 [16];
  char *what_arg;
  void *pvVar2;
  ulong uVar3;
  int in_ESI;
  SBPL_Exception *in_RDI;
  int eind_1;
  int eind;
  int local_24;
  int local_20;
  
  if (*(long *)(*(long *)in_RDI + (long)in_ESI * 8) == 0) {
    if (*(int *)&in_RDI[3].field_0x8 == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)*(int *)&in_RDI[1].field_0x4;
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar2 = operator_new__(uVar3);
      *(void **)(*(long *)in_RDI + (long)in_ESI * 8) = pvVar2;
      for (local_24 = 0; local_24 < *(int *)&in_RDI[1].field_0x4; local_24 = local_24 + 1) {
        *(undefined8 *)(*(long *)(*(long *)in_RDI + (long)in_ESI * 8) + (long)local_24 * 8) = 0;
      }
    }
    else {
      *(undefined4 *)(*(long *)(in_RDI + 3) + (long)in_ESI * 4) =
           *(undefined4 *)&in_RDI[3].field_0x8;
      pvVar2 = malloc((long)*(int *)(*(long *)(in_RDI + 3) + (long)in_ESI * 4) << 3);
      *(void **)(*(long *)in_RDI + (long)in_ESI * 8) = pvVar2;
      for (local_20 = 0; local_20 < *(int *)(*(long *)(in_RDI + 3) + (long)in_ESI * 4);
          local_20 = local_20 + 1) {
        *(undefined8 *)(*(long *)(*(long *)in_RDI + (long)in_ESI * 8) + (long)local_20 * 8) = 0;
      }
    }
    return;
  }
  what_arg = (char *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception(in_RDI,what_arg);
  __cxa_throw(what_arg,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
}

Assistant:

void createbucket(int bucketindex)
    {
        if (bucketV[bucketindex] != NULL) {
            throw SBPL_Exception("ERROR: trying to create a non-null bucket");
        }

        if(initialdynamicsize)
        {
            dynamicsize[bucketindex] = initialdynamicsize;
            bucketV[bucketindex] = (AbstractSearchState**) malloc(sizeof(AbstractSearchState*) *  dynamicsize[bucketindex] );
            for (int eind = 0; eind < dynamicsize[bucketindex]; eind++)
                bucketV[bucketindex][eind] = NULL;
        }
        else
        {
            bucketV[bucketindex] = new AbstractSearchState*[bucketsize];
            for (int eind = 0; eind < bucketsize; eind++)
                bucketV[bucketindex][eind] = NULL;
        }
    }